

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
cppcms::json::traits<std::vector<int,_std::allocator<int>_>_>::get(value *v)

{
  int iVar1;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *this;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint i;
  array *a;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *__new_size;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  
  pvVar5 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1229c5);
  this = (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)
         cppcms::json::value::array();
  __new_size = this;
  std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size(this);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)__new_size);
  for (uVar6 = 0; uVar2 = (ulong)uVar6,
      sVar3 = std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size(this),
      uVar2 < sVar3; uVar6 = uVar6 + 1) {
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
              (this,(ulong)uVar6);
    iVar1 = value::get_value<int>((value *)0x122a39);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)uVar6);
    *pvVar4 = iVar1;
  }
  return pvVar5;
}

Assistant:

static std::vector<T> get(value const &v)
		{
			std::vector<T> result;
			json::array const &a=v.array();
			result.resize(a.size());
			for(unsigned i=0;i<a.size();i++) 
				result[i]=a[i].get_value<T>();
			return result;
		}